

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
               (CodedInputStream *input,int64_t *value)

{
  uint8_t *puVar1;
  ulong uVar2;
  pair<unsigned_long,_bool> pVar3;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (uVar2 = (ulong)(char)*puVar1, -1 < (long)uVar2)) {
    input->buffer_ = puVar1 + 1;
  }
  else {
    pVar3 = io::CodedInputStream::ReadVarint64Fallback(input);
    uVar2 = pVar3.first;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return false;
    }
  }
  *value = -(ulong)((uint)uVar2 & 1) ^ uVar2 >> 1;
  return true;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int64_t, WireFormatLite::TYPE_SINT64>(
    io::CodedInputStream* input, int64_t* value) {
  uint64_t temp;
  if (!input->ReadVarint64(&temp)) return false;
  *value = ZigZagDecode64(temp);
  return true;
}